

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O1

ZNames * __thiscall
icu_63::TimeZoneNamesImpl::loadMetaZoneNames
          (TimeZoneNamesImpl *this,UnicodeString *mzID,UErrorCode *status)

{
  short sVar1;
  UErrorCode UVar2;
  UHashtable *cache;
  int iVar3;
  ZNames *pZVar4;
  ZNames *pZVar5;
  long lVar6;
  ZNamesLoader loader;
  UChar mzIDKey [129];
  Char16Ptr local_180;
  char16_t *local_178;
  ZNamesLoader local_168;
  char16_t local_128 [132];
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_180.p_ = local_128;
    icu_63::UnicodeString::extract(mzID,&local_180,0x81,status);
    local_178 = local_180.p_;
    sVar1 = (mzID->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (mzID->fUnion).fFields.fLength;
    }
    else {
      iVar3 = (int)sVar1 >> 5;
    }
    local_128[iVar3] = L'\0';
    pZVar4 = (ZNames *)uhash_get_63(this->fMZNamesMap,local_128);
    if (pZVar4 == (ZNames *)0x0) {
      local_168.super_ResourceSink.super_UObject._vptr_UObject =
           (UObject)&PTR__ZNamesLoader_00479ac8;
      local_168.names[0] = (UChar *)0x0;
      local_168.names[1] = (UChar *)0x0;
      local_168.names[2] = (UChar *)0x0;
      local_168.names[3] = (UChar *)0x0;
      local_168.names[4] = (UChar *)0x0;
      local_168.names[5] = (UChar *)0x0;
      local_168.names[6] = (UChar *)0x0;
      ZNames::ZNamesLoader::loadMetaZone(&local_168,this->fZoneStrings,mzID,status);
      cache = this->fMZNamesMap;
      lVar6 = 1;
      do {
        if (local_168.names[lVar6 + -1] == L"") {
          local_168.names[lVar6 + -1] = (UChar *)0x0;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 8);
      pZVar4 = (ZNames *)ZNames::createMetaZoneAndPutInCache(cache,local_168.names,mzID,status);
      UVar2 = *status;
      ResourceSink::~ResourceSink(&local_168.super_ResourceSink);
      if (U_ZERO_ERROR < UVar2) goto LAB_00284b59;
    }
    pZVar5 = (ZNames *)0x0;
    if (pZVar4 != (ZNames *)"<empty>") {
      pZVar5 = pZVar4;
    }
  }
  else {
LAB_00284b59:
    pZVar5 = (ZNames *)0x0;
  }
  return pZVar5;
}

Assistant:

const UChar* getName(UTimeZoneNameType type) const {
        UTimeZoneNameTypeIndex index = getTZNameTypeIndex(type);
        return index >= 0 ? fNames[index] : NULL;
    }